

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeBBox *a_rect,ON_SimpleArray<ON_RTreeLeaf> *a_result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 in_AL;
  bool bVar6;
  ON_RTreeLeaf *pOVar7;
  long lVar8;
  long lVar9;
  ON_RTreeBBox *a_rectB;
  
  lVar9 = (long)a_node->m_count;
  if (0 < lVar9) {
    a_rectB = &a_node->m_branch[0].m_rect;
    if (a_node->m_level < 1) {
      do {
        bVar6 = OverlapHelper(a_rect,a_rectB);
        pOVar7 = (ON_RTreeLeaf *)(ulong)bVar6;
        if (bVar6) {
          pOVar7 = ON_SimpleArray<ON_RTreeLeaf>::AppendNew(a_result);
          dVar1 = a_rectB->m_min[1];
          dVar2 = a_rectB->m_min[2];
          dVar3 = a_rectB->m_max[0];
          dVar4 = a_rectB->m_max[1];
          dVar5 = a_rectB->m_max[2];
          (pOVar7->m_rect).m_min[0] = a_rectB->m_min[0];
          (pOVar7->m_rect).m_min[1] = dVar1;
          (pOVar7->m_rect).m_min[2] = dVar2;
          (pOVar7->m_rect).m_max[0] = dVar3;
          (pOVar7->m_rect).m_max[1] = dVar4;
          (pOVar7->m_rect).m_max[2] = dVar5;
          pOVar7->m_id = (ON__INT_PTR)a_rectB[1].m_min[0];
        }
        in_AL = SUB81(pOVar7,0);
        a_rectB = (ON_RTreeBBox *)(a_rectB[1].m_min + 1);
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    else {
      lVar8 = 0;
      do {
        in_AL = OverlapHelper(a_rect,(ON_RTreeBBox *)
                                     ((long)(((ON_RTreeBranch *)a_rectB)->m_rect).m_min + lVar8));
        if ((bool)in_AL) {
          in_AL = SearchHelper(*(ON_RTreeNode **)((long)(&a_node->m_branch[0].m_rect + 1) + lVar8),
                               a_rect,a_result);
        }
        lVar8 = lVar8 + 0x38;
      } while (lVar9 * 0x38 - lVar8 != 0);
    }
  }
  return (bool)in_AL;
}

Assistant:

static bool SearchHelper(const ON_RTreeNode* a_node, const ON_RTreeBBox* a_rect, ON_SimpleArray<ON_RTreeLeaf> &a_result)
{
  int i, count;

  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      for( i=0; i < count; ++i )
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          if(!SearchHelper(branch[i].m_child, a_rect, a_result) )
          {
            return false; // Don't continue searching
          }
        }
      }
    }
    else
    {
      // a_node is a leaf node - return point to the branch
      for(i=0; i < count; ++i)
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          ON_RTreeLeaf& leaf = a_result.AppendNew();
          leaf.m_rect = branch[i].m_rect;
          leaf.m_id = branch[i].m_id;
        }
      }
    }
  }

  return true; // Continue searching
}